

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::CodeGeneratorResponse_File
          (CodeGeneratorResponse_File *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorResponse_File_0041ff90;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  if (this != (CodeGeneratorResponse_File *)&_CodeGeneratorResponse_File_default_instance_) {
    protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->insertion_point_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->content_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  return;
}

Assistant:

CodeGeneratorResponse_File::CodeGeneratorResponse_File()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.compiler.CodeGeneratorResponse.File)
}